

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::buildFrameBuffer
          (BasicGraphicsTestInstance *this,UVec2 *renderSize,VkFormat colorFormat,
          VkFormat depthFormat)

{
  VkImage VVar1;
  deUint64 dVar2;
  VkImageView VVar3;
  VkFramebuffer obj;
  DeviceInterface *vk;
  VkDevice device;
  Move<vk::Handle<(vk::HandleType)9>_> local_d8;
  Move<vk::Handle<(vk::HandleType)13>_> local_b8;
  VkImageViewCreateInfo colorAttachmentViewParams;
  VkImageView attachmentBindInfos [2];
  
  vk = Context::getDeviceInterface((this->super_TimestampTestInstance).super_TestInstance.m_context)
  ;
  device = Context::getDevice((this->super_TimestampTestInstance).super_TestInstance.m_context);
  TimestampTestInstance::createImage2DAndBindMemory
            (&local_d8,&this->super_TimestampTestInstance,colorFormat,renderSize->m_data[0],
             renderSize->m_data[1],0x11,VK_SAMPLE_COUNT_1_BIT,&this->m_colorImageAlloc);
  colorAttachmentViewParams._16_8_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  colorAttachmentViewParams.image.m_internal =
       (deUint64)local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  colorAttachmentViewParams._0_8_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  colorAttachmentViewParams.pNext =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar1.m_internal =
       (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar1.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar1);
  }
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)colorAttachmentViewParams._16_8_;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentViewParams.image.m_internal;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       colorAttachmentViewParams._0_8_;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)colorAttachmentViewParams.pNext;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  TimestampTestInstance::createImage2DAndBindMemory
            (&local_d8,&this->super_TimestampTestInstance,depthFormat,renderSize->m_data[0],
             renderSize->m_data[1],0x20,VK_SAMPLE_COUNT_1_BIT,&this->m_depthImageAlloc);
  colorAttachmentViewParams._16_8_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  colorAttachmentViewParams.image.m_internal =
       (deUint64)local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  colorAttachmentViewParams._0_8_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  colorAttachmentViewParams.pNext =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar1.m_internal =
       (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar1.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar1);
  }
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)colorAttachmentViewParams._16_8_;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentViewParams.image.m_internal;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       colorAttachmentViewParams._0_8_;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)colorAttachmentViewParams.pNext;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  colorAttachmentViewParams.image.m_internal =
       (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  dVar2 = (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal;
  this->m_imageLayoutBarriers[0].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[0].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[0].srcAccessMask = 0;
  this->m_imageLayoutBarriers[0].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[0].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[0].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].image.m_internal = colorAttachmentViewParams.image.m_internal;
  this->m_imageLayoutBarriers[0].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.layerCount = 1;
  this->m_imageLayoutBarriers[1].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[1].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[1].srcAccessMask = 0;
  this->m_imageLayoutBarriers[1].dstAccessMask = 0x400;
  this->m_imageLayoutBarriers[1].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[1].newLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[1].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].image.m_internal = dVar2;
  this->m_imageLayoutBarriers[1].subresourceRange.aspectMask = 2;
  this->m_imageLayoutBarriers[1].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.layerCount = 1;
  colorAttachmentViewParams.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  colorAttachmentViewParams.pNext = (void *)0x0;
  colorAttachmentViewParams._16_8_ = colorAttachmentViewParams._16_8_ & 0xffffffff00000000;
  colorAttachmentViewParams.viewType = VK_IMAGE_VIEW_TYPE_2D;
  colorAttachmentViewParams.components.r = VK_COMPONENT_SWIZZLE_R;
  colorAttachmentViewParams.components.g = VK_COMPONENT_SWIZZLE_G;
  colorAttachmentViewParams.components.b = VK_COMPONENT_SWIZZLE_B;
  colorAttachmentViewParams.components.a = VK_COMPONENT_SWIZZLE_A;
  colorAttachmentViewParams.subresourceRange.aspectMask = 1;
  colorAttachmentViewParams.subresourceRange.baseMipLevel = 0;
  colorAttachmentViewParams.subresourceRange.levelCount = 1;
  colorAttachmentViewParams.subresourceRange.baseArrayLayer = 0;
  colorAttachmentViewParams.subresourceRange.layerCount = 1;
  colorAttachmentViewParams.format = colorFormat;
  ::vk::createImageView(&local_b8,vk,device,&colorAttachmentViewParams,(VkAllocationCallbacks *)0x0)
  ;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar3.m_internal =
       (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar3.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar3);
  }
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  colorAttachmentViewParams.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  colorAttachmentViewParams.pNext = (void *)0x0;
  colorAttachmentViewParams._16_8_ = colorAttachmentViewParams._16_8_ & 0xffffffff00000000;
  colorAttachmentViewParams.image.m_internal =
       (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  colorAttachmentViewParams.viewType = VK_IMAGE_VIEW_TYPE_2D;
  colorAttachmentViewParams.components.r = VK_COMPONENT_SWIZZLE_R;
  colorAttachmentViewParams.components.g = VK_COMPONENT_SWIZZLE_G;
  colorAttachmentViewParams.components.b = VK_COMPONENT_SWIZZLE_B;
  colorAttachmentViewParams.components.a = VK_COMPONENT_SWIZZLE_A;
  colorAttachmentViewParams.subresourceRange.aspectMask = 2;
  colorAttachmentViewParams.subresourceRange.baseMipLevel = 0;
  colorAttachmentViewParams.subresourceRange.levelCount = 1;
  colorAttachmentViewParams.subresourceRange.baseArrayLayer = 0;
  colorAttachmentViewParams.subresourceRange.layerCount = 1;
  colorAttachmentViewParams.format = depthFormat;
  ::vk::createImageView(&local_b8,vk,device,&colorAttachmentViewParams,(VkAllocationCallbacks *)0x0)
  ;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar3.m_internal =
       (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar3.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar3);
  }
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  attachmentBindInfos[0].m_internal =
       (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  colorAttachmentViewParams.components._0_8_ = attachmentBindInfos;
  attachmentBindInfos[1].m_internal =
       (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  colorAttachmentViewParams.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  colorAttachmentViewParams.pNext = (void *)0x0;
  colorAttachmentViewParams._16_8_ = colorAttachmentViewParams._16_8_ & 0xffffffff00000000;
  colorAttachmentViewParams.image.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  colorAttachmentViewParams.viewType = VK_IMAGE_VIEW_TYPE_3D;
  colorAttachmentViewParams.components._8_8_ = *(undefined8 *)renderSize->m_data;
  colorAttachmentViewParams.subresourceRange.aspectMask = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&local_b8,vk,device,
             (VkFramebufferCreateInfo *)&colorAttachmentViewParams,(VkAllocationCallbacks *)0x0);
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = local_d8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
               &local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkFramebuffer)
               local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  return;
}

Assistant:

void BasicGraphicsTestInstance::buildFrameBuffer(tcu::UVec2 renderSize, VkFormat colorFormat, VkFormat depthFormat)
{
	const DeviceInterface&      vk                   = m_context.getDeviceInterface();
	const VkDevice              vkDevice             = m_context.getDevice();
	const VkComponentMapping    ComponentMappingRGBA = { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A};

	// Create color image
	{
		m_colorImage = createImage2DAndBindMemory(colorFormat,
												  renderSize.x(),
												  renderSize.y(),
												  VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_colorImageAlloc);
	}

	// Create depth image
	{
		m_depthImage = createImage2DAndBindMemory(depthFormat,
												  renderSize.x(),
												  renderSize.y(),
												  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_depthImageAlloc);
	}

	// Set up image layout transition barriers
	{
		const VkImageMemoryBarrier colorImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_colorImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};
		const VkImageMemoryBarrier depthImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_depthImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[0] = colorImageBarrier;
		m_imageLayoutBarriers[1] = depthImageBarrier;
	}

	// Create color attachment view
	{
		const VkImageViewCreateInfo colorAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_colorImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			colorFormat,                                    // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_colorAttachmentView = createImageView(vk, vkDevice, &colorAttachmentViewParams);
	}

	// Create depth attachment view
	{
		const VkImageViewCreateInfo depthAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_depthImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			depthFormat,                                    // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_depthAttachmentView = createImageView(vk, vkDevice, &depthAttachmentViewParams);
	}

	// Create framebuffer
	{
		const VkImageView attachmentBindInfos[2] =
		{
			*m_colorAttachmentView,
			*m_depthAttachmentView,
		};

		const VkFramebufferCreateInfo framebufferParams =
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,          // VkStructureType              sType;
			DE_NULL,                                            // const void*                  pNext;
			0u,                                                 // VkFramebufferCreateFlags     flags;
			*m_renderPass,                                      // VkRenderPass                 renderPass;
			2u,                                                 // deUint32                     attachmentCount;
			attachmentBindInfos,                                // const VkImageView*           pAttachments;
			(deUint32)renderSize.x(),                           // deUint32                     width;
			(deUint32)renderSize.y(),                           // deUint32                     height;
			1u,                                                 // deUint32                     layers;
		};

		m_framebuffer = createFramebuffer(vk, vkDevice, &framebufferParams);
	}

}